

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInCount(void *handle,int net_type,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint32_t *in_RCX;
  char *in_RDX;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  bool is_bitcoin;
  string *in_stack_fffffffffffffd38;
  ConfidentialTransactionContext *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  ConfidentialTransactionContext *in_stack_fffffffffffffd70;
  bool *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda4;
  allocator local_251;
  string local_250 [32];
  ConfidentialTransaction local_230 [3];
  allocator local_151;
  string local_150 [32];
  Transaction local_130 [2];
  byte local_73;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  uint32_t *local_28;
  char *local_20;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    local_73 = 0;
    cfd::capi::ConvertNetType(in_stack_fffffffffffffda4,in_stack_fffffffffffffd98);
    if ((local_73 & 1) == 0) {
      paVar4 = &local_251;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,local_20,paVar4);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (in_stack_fffffffffffffd70,
                 (string *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      if (local_28 != (uint32_t *)0x0) {
        uVar2 = cfd::core::ConfidentialTransaction::GetTxInCount(local_230);
        *local_28 = uVar2;
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                (in_stack_fffffffffffffd40);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,local_20,&local_151);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      if (local_28 != (uint32_t *)0x0) {
        uVar2 = cfd::core::Transaction::GetTxInCount(local_130);
        *local_28 = uVar2;
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffffd40);
    }
    return 0;
  }
  local_50.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_50.filename = local_50.filename + 1;
  local_50.line = 0xa73;
  local_50.funcname = "CfdGetTxInCount";
  cfd::core::logger::warn<>(&local_50,"tx is null or empty.");
  local_72 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Failed to parameter. tx is null or empty.",&local_71);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffd60,error_code,
             (string *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  local_72 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInCount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxInCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxInCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}